

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_add_filter_by_name.c
# Opt level: O0

void test_filter_by_name(char *filter_name,int filter_code,_func_int *can_filter_prog)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  mode_t mVar4;
  void *__ptr;
  time_t tVar5;
  char *pcVar6;
  la_ssize_t v2;
  la_int64_t v2_00;
  long v1;
  int r;
  char *buff;
  size_t buffsize;
  size_t used;
  archive *a;
  archive_entry *ae;
  _func_int *can_filter_prog_local;
  char *pcStack_10;
  int filter_code_local;
  char *filter_name_local;
  
  ae = (archive_entry *)can_filter_prog;
  can_filter_prog_local._4_4_ = filter_code;
  pcStack_10 = filter_name;
  __ptr = calloc(0x20000,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                   ,L'\'',(uint)(__ptr != (void *)0x0),
                   "(buff = calloc(buffsize, sizeof(*buff))) != NULL",(void *)0x0);
  if (__ptr == (void *)0x0) {
    return;
  }
  used = (size_t)archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                   ,L',',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_write_new()) != NULL",(void *)0x0);
  iVar1 = archive_write_set_format_ustar((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",
                      (void *)used);
  iVar1 = archive_write_add_filter_by_name((archive *)used,pcStack_10);
  if (iVar1 == -0x14) {
    iVar1 = (*(code *)ae)();
    if (iVar1 == 0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                     ,L'1');
      test_skipping("%s filter not supported on this platform",pcStack_10);
      iVar1 = archive_write_free((archive *)used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(__ptr);
      return;
    }
  }
  else {
    if (iVar1 == -0x1e) {
      pcVar6 = archive_error_string((archive *)used);
      iVar2 = strcmp(pcVar6,"lzma compression not supported on this platform");
      if (iVar2 == 0) {
LAB_0013986a:
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                       ,L'<');
        test_skipping("%s filter not supported on this platform",pcStack_10);
        iVar1 = archive_write_free((archive *)used);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                            ,L'=',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
        free(__ptr);
        return;
      }
      pcVar6 = archive_error_string((archive *)used);
      iVar2 = strcmp(pcVar6,"xz compression not supported on this platform");
      if (iVar2 == 0) goto LAB_0013986a;
    }
    wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                                ,L'A',0,"ARCHIVE_OK",(long)iVar1,"r",(void *)used);
    if (wVar3 == L'\0') {
      iVar1 = archive_write_free((archive *)used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'B',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(__ptr);
      return;
    }
  }
  if (can_filter_prog_local._4_4_ == 10) {
    iVar1 = archive_write_set_options((archive *)used,"lrzip:compression=none");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                        ,L'O',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_write_set_options(a, \"lrzip:compression=none\")",(void *)used);
  }
  iVar1 = archive_write_set_bytes_per_block((archive *)used,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'Q',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_bytes_per_block(a, 10)",
                      (void *)used);
  iVar1 = archive_write_open_memory((archive *)used,__ptr,0x20000,&buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                   ,L'X',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime((archive_entry *)a,1,0);
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'Z',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  archive_entry_set_ctime((archive_entry *)a,1,0);
  tVar5 = archive_entry_ctime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'\\',1,"1",tVar5,"archive_entry_ctime(ae)",(void *)0x0);
  archive_entry_set_atime((archive_entry *)a,1,0);
  tVar5 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'^',1,"1",tVar5,"archive_entry_atime(ae)",(void *)0x0);
  archive_entry_copy_pathname((archive_entry *)a,"file");
  pcVar6 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
             ,L'`',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode((archive_entry *)a,0x81ed);
  mVar4 = archive_entry_mode((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'b',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar4,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size((archive_entry *)a,8);
  iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'd',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free((archive_entry *)a);
  v2 = archive_write_data((archive *)used,"12345678",8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'f',8,"8",v2,"archive_write_data(a, \"12345678\", 8)",(void *)0x0);
  iVar1 = archive_write_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'i',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
  iVar1 = archive_write_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'j',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  used = (size_t)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                   ,L'o',(uint)((archive *)used != (archive *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'p',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                      (void *)used);
  iVar1 = archive_read_support_filter_all((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                      (void *)used);
  iVar1 = archive_read_open_memory((archive *)used,__ptr,buffsize);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      (void *)used);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'w',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)used);
  tVar5 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'x',1,"1",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
             ,L'y',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar4 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'z',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  v2_00 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'{',8,"8",v2_00,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)used,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'~',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)used);
  v1 = (long)can_filter_prog_local._4_4_;
  iVar1 = archive_filter_code((archive *)used,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'\x81',v1,"filter_code",(long)iVar1,"archive_filter_code(a, 0)",(void *)used
                     );
  iVar1 = archive_format((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'\x82',0x30001,"ARCHIVE_FORMAT_TAR_USTAR",(long)iVar1,"archive_format(a)",
                      (void *)used);
  iVar1 = archive_read_close((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'\x84',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'\x85',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free(__ptr);
  return;
}

Assistant:

static void
test_filter_by_name(const char *filter_name, int filter_code,
    int (*can_filter_prog)(void))
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 128;
	char *buff;
	int r;

	assert((buff = calloc(buffsize, sizeof(*buff))) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_by_name(a, filter_name);
	if (r == ARCHIVE_WARN) {
		if (!can_filter_prog()) {
			skipping("%s filter not supported on this platform",
			    filter_name);
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	} else if (r == ARCHIVE_FATAL &&
	    (strcmp(archive_error_string(a),
		   "lzma compression not supported on this platform") == 0 ||
	     strcmp(archive_error_string(a),
		   "xz compression not supported on this platform") == 0)) {
		skipping("%s filter not supported on this platform", filter_name);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	} else {
		if (!assertEqualIntA(a, ARCHIVE_OK, r)) {
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	}
	if (filter_code == ARCHIVE_FILTER_LRZIP)
	{
		/*
		 * There's a bug in lrzip (as of release 0.612) where 2nd stage
		 * compression can't be performed on smaller files. Set lrzip to
		 * use no 2nd stage compression.
		 */
		assertEqualIntA(a, ARCHIVE_OK,
			archive_write_set_options(a, "lrzip:compression=none"));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/*
	 * Read and verify the file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(8, archive_entry_size(ae));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, filter_code, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_USTAR, archive_format(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(buff);
}